

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTIMUMPU9250.cpp
# Opt level: O3

bool __thiscall RTIMUMPU9250::setCompassRate(RTIMUMPU9250 *this)

{
  long lVar1;
  bool bVar2;
  char cVar3;
  
  lVar1 = (long)(this->super_RTIMU).m_sampleRate / (long)this->m_compassRate;
  cVar3 = ' ';
  if ((int)lVar1 < 0x20) {
    cVar3 = (char)lVar1;
  }
  bVar2 = RTIMUHal::HALWrite(&((this->super_RTIMU).m_settings)->super_RTIMUHal,this->m_slaveAddr,'4'
                             ,cVar3 + 0xff,"Failed to set slave ctrl 4");
  return bVar2;
}

Assistant:

bool RTIMUMPU9250::setCompassRate()
{
    int rate;

    rate = m_sampleRate / m_compassRate - 1;

    if (rate > 31)
        rate = 31;
    if (!m_settings->HALWrite(m_slaveAddr, MPU9250_I2C_SLV4_CTRL, rate, "Failed to set slave ctrl 4"))
         return false;
    return true;
}